

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  float fVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar5;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar6;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar7;
  int iVar8;
  StackItemT<embree::NodeRefPtr<4>_> SVar9;
  AccelData *pAVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar23;
  _func_int **pp_Var24;
  long lVar25;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  size_t sVar32;
  size_t sVar33;
  size_t sVar34;
  byte bVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined4 uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vint4 ai;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 bi;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vint4 ai_3;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 bi_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  vint4 bi_2;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vint4 bi_4;
  undefined1 auVar87 [16];
  vint4 ai_2;
  undefined1 auVar88 [16];
  vint4 bi_3;
  int in_XMM10_Da;
  int in_XMM10_Db;
  int in_XMM10_Dc;
  int in_XMM10_Dd;
  undefined1 auVar89 [64];
  int in_XMM11_Da;
  int in_XMM11_Db;
  int in_XMM11_Dc;
  int in_XMM11_Dd;
  undefined1 auVar90 [64];
  int in_XMM12_Da;
  int in_XMM12_Db;
  int in_XMM12_Dc;
  int in_XMM12_Dd;
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 in_ZMM31 [64];
  vint<4> octant;
  undefined1 local_11d8 [16];
  RTCIntersectFunctionNArguments local_11c8;
  Geometry *local_1198;
  undefined8 local_1190;
  RTCIntersectArguments *local_1188;
  vfloat<4> fmin;
  uint local_1128 [4];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar39 [16];
  undefined1 auVar73 [64];
  
  auVar45 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  uVar36 = vpcmpeqd_avx512vl(auVar45,(undefined1  [16])valid_i->field_0);
  uVar36 = uVar36 & 0xf;
  if ((byte)uVar36 != 0) {
    pAVar10 = This->ptr;
    auVar44 = *(undefined1 (*) [16])(ray + 0x40);
    auVar42._8_4_ = 0x7fffffff;
    auVar42._0_8_ = 0x7fffffff7fffffff;
    auVar42._12_4_ = 0x7fffffff;
    auVar38 = vandps_avx(auVar44,auVar42);
    auVar82._8_4_ = 0x219392ef;
    auVar82._0_8_ = 0x219392ef219392ef;
    auVar82._12_4_ = 0x219392ef;
    uVar29 = vcmpps_avx512vl(auVar38,auVar82,1);
    auVar38 = vblendmps_avx512vl(auVar44,auVar82);
    bVar12 = (bool)((byte)uVar29 & 1);
    auVar43._0_4_ = (uint)bVar12 * auVar38._0_4_ | (uint)!bVar12 * in_XMM10_Da;
    bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
    auVar43._4_4_ = (uint)bVar12 * auVar38._4_4_ | (uint)!bVar12 * in_XMM10_Db;
    bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
    auVar43._8_4_ = (uint)bVar12 * auVar38._8_4_ | (uint)!bVar12 * in_XMM10_Dc;
    bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar43._12_4_ = (uint)bVar12 * auVar38._12_4_ | (uint)!bVar12 * in_XMM10_Dd;
    auVar38 = *(undefined1 (*) [16])(ray + 0x50);
    auVar39 = vandps_avx(auVar38,auVar42);
    uVar29 = vcmpps_avx512vl(auVar39,auVar82,1);
    auVar39 = vblendmps_avx512vl(auVar38,auVar82);
    bVar12 = (bool)((byte)uVar29 & 1);
    auVar40._0_4_ = (uint)bVar12 * auVar39._0_4_ | (uint)!bVar12 * in_XMM11_Da;
    bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
    auVar40._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * in_XMM11_Db;
    bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
    auVar40._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * in_XMM11_Dc;
    bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar40._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * in_XMM11_Dd;
    auVar39 = *(undefined1 (*) [16])(ray + 0x60);
    auVar41 = vandps_avx(auVar39,auVar42);
    uVar29 = vcmpps_avx512vl(auVar41,auVar82,1);
    auVar41 = vblendmps_avx512vl(auVar39,auVar82);
    bVar12 = (bool)((byte)uVar29 & 1);
    auVar61._0_4_ = (uint)bVar12 * auVar41._0_4_ | (uint)!bVar12 * in_XMM12_Da;
    bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
    auVar61._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * in_XMM12_Db;
    bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
    auVar61._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * in_XMM12_Dc;
    bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar61._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * in_XMM12_Dd;
    auVar42 = vrcp14ps_avx512vl(auVar43);
    auVar82 = ZEXT816(0) << 0x40;
    auVar83._8_4_ = 0x3f800000;
    auVar83._0_8_ = 0x3f8000003f800000;
    auVar83._12_4_ = 0x3f800000;
    auVar41 = vfnmadd213ps_fma(auVar43,auVar42,auVar83);
    local_1078 = vfmadd132ps_fma(auVar41,auVar42,auVar42);
    auVar89 = ZEXT1664(local_1078);
    auVar43 = vrcp14ps_avx512vl(auVar40);
    auVar41 = vfnmadd213ps_fma(auVar40,auVar43,auVar83);
    local_1088 = vfmadd132ps_fma(auVar41,auVar43,auVar43);
    auVar90 = ZEXT1664(local_1088);
    auVar43 = vrcp14ps_avx512vl(auVar61);
    auVar41 = vfnmadd213ps_fma(auVar61,auVar43,auVar83);
    local_1098 = vfmadd132ps_fma(auVar41,auVar43,auVar43);
    auVar91 = ZEXT1664(local_1098);
    local_1108 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar82);
    auVar44 = vcmpps_avx(auVar44,auVar82,1);
    auVar41._8_4_ = 1;
    auVar41._0_8_ = 0x100000001;
    auVar41._12_4_ = 1;
    auVar41 = vandps_avx512vl(auVar44,auVar41);
    uVar29 = vcmpps_avx512vl(auVar38,auVar82,1);
    auVar79._8_4_ = 2;
    auVar79._0_8_ = 0x200000002;
    auVar79._12_4_ = 2;
    auVar44 = vpsubd_avx512vl(auVar79,auVar44);
    bVar12 = (bool)((byte)uVar29 & 1);
    auVar38._0_4_ = (uint)bVar12 * auVar44._0_4_ | (uint)!bVar12 * auVar41._0_4_;
    bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
    auVar38._4_4_ = (uint)bVar12 * auVar44._4_4_ | (uint)!bVar12 * auVar41._4_4_;
    bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
    auVar38._8_4_ = (uint)bVar12 * auVar44._8_4_ | (uint)!bVar12 * auVar41._8_4_;
    bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar38._12_4_ = (uint)bVar12 * auVar44._12_4_ | (uint)!bVar12 * auVar41._12_4_;
    uVar29 = vcmpps_avx512vl(auVar39,auVar82,1);
    auVar44._8_4_ = 4;
    auVar44._0_8_ = 0x400000004;
    auVar44._12_4_ = 4;
    auVar44 = vpord_avx512vl(auVar38,auVar44);
    bVar12 = (bool)((byte)uVar29 & 1);
    auVar39._0_4_ = (uint)bVar12 * auVar44._0_4_ | !bVar12 * auVar38._0_4_;
    bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
    auVar39._4_4_ = (uint)bVar12 * auVar44._4_4_ | !bVar12 * auVar38._4_4_;
    bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
    auVar39._8_4_ = (uint)bVar12 * auVar44._8_4_ | !bVar12 * auVar38._8_4_;
    bVar12 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar39._12_4_ = (uint)bVar12 * auVar44._12_4_ | !bVar12 * auVar38._12_4_;
    local_1118 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar82);
    auVar44 = vmovdqa32_avx512vl(auVar39);
    bVar12 = (bool)((byte)uVar36 & 1);
    bVar13 = (bool)((byte)(uVar36 >> 1) & 1);
    bVar14 = (bool)((byte)(uVar36 >> 2) & 1);
    bVar16 = SUB81(uVar36 >> 3,0);
    local_1128[0] = (uint)bVar12 * auVar44._0_4_ | (uint)!bVar12 * auVar45._0_4_;
    local_1128[1] = (uint)bVar13 * auVar44._4_4_ | (uint)!bVar13 * auVar45._4_4_;
    local_1128[2] = (uint)bVar14 * auVar44._8_4_ | (uint)!bVar14 * auVar45._8_4_;
    local_1128[3] = (uint)bVar16 * auVar44._12_4_ | (uint)!bVar16 * auVar45._12_4_;
    local_10d8 = *(float *)ray;
    fStack_10d4 = *(float *)(ray + 4);
    fStack_10d0 = *(float *)(ray + 8);
    fStack_10cc = *(float *)(ray + 0xc);
    local_10a8._0_4_ = local_1078._0_4_ * -*(float *)ray;
    local_10a8._4_4_ = local_1078._4_4_ * -*(float *)(ray + 4);
    local_10a8._8_4_ = local_1078._8_4_ * -*(float *)(ray + 8);
    local_10a8._12_4_ = local_1078._12_4_ * -*(float *)(ray + 0xc);
    auVar92 = ZEXT1664(local_10a8);
    local_10e8 = *(float *)(ray + 0x10);
    fStack_10e4 = *(float *)(ray + 0x14);
    fStack_10e0 = *(float *)(ray + 0x18);
    fStack_10dc = *(float *)(ray + 0x1c);
    local_10b8._0_4_ = local_1088._0_4_ * -*(float *)(ray + 0x10);
    local_10b8._4_4_ = local_1088._4_4_ * -*(float *)(ray + 0x14);
    local_10b8._8_4_ = local_1088._8_4_ * -*(float *)(ray + 0x18);
    local_10b8._12_4_ = local_1088._12_4_ * -*(float *)(ray + 0x1c);
    auVar93 = ZEXT1664(local_10b8);
    local_10f8 = *(float *)(ray + 0x20);
    fStack_10f4 = *(float *)(ray + 0x24);
    fStack_10f0 = *(float *)(ray + 0x28);
    fStack_10ec = *(float *)(ray + 0x2c);
    local_10c8._0_4_ = local_1098._0_4_ * -*(float *)(ray + 0x20);
    local_10c8._4_4_ = local_1098._4_4_ * -*(float *)(ray + 0x24);
    local_10c8._8_4_ = local_1098._8_4_ * -*(float *)(ray + 0x28);
    local_10c8._12_4_ = local_1098._12_4_ * -*(float *)(ray + 0x2c);
    auVar94 = ZEXT1664(local_10c8);
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar95 = ZEXT1664(auVar45);
    do {
      lVar25 = 0;
      for (uVar29 = uVar36; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar27 = local_1128[lVar25];
      auVar66._4_4_ = uVar27;
      auVar66._0_4_ = uVar27;
      auVar66._8_4_ = uVar27;
      auVar66._12_4_ = uVar27;
      auVar45._4_4_ = local_1128[1];
      auVar45._0_4_ = local_1128[0];
      auVar45._8_4_ = local_1128[2];
      auVar45._12_4_ = local_1128[3];
      uVar37 = vpcmpeqd_avx512vl(auVar66,auVar45);
      uVar37 = uVar37 & 0xf;
      bVar35 = (byte)uVar37;
      uVar36 = (long)(char)~bVar35 & uVar36;
      auVar22._4_4_ = fStack_10d4;
      auVar22._0_4_ = local_10d8;
      auVar22._8_4_ = fStack_10d0;
      auVar22._12_4_ = fStack_10cc;
      auVar40 = auVar95._0_16_;
      auVar45 = vblendmps_avx512vl(auVar40,auVar22);
      auVar46._0_4_ = (uint)(bVar35 & 1) * auVar45._0_4_ | !(bool)(bVar35 & 1) * uVar27;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar12 * auVar45._4_4_ | !bVar12 * uVar27;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar12 * auVar45._8_4_ | !bVar12 * uVar27;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar46._12_4_ = (uint)bVar12 * auVar45._12_4_ | !bVar12 * uVar27;
      auVar45 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar45 = vminps_avx(auVar45,auVar46);
      auVar44 = vshufpd_avx(auVar45,auVar45,1);
      auVar45 = vminps_avx(auVar44,auVar45);
      auVar21._4_4_ = fStack_10e4;
      auVar21._0_4_ = local_10e8;
      auVar21._8_4_ = fStack_10e0;
      auVar21._12_4_ = fStack_10dc;
      auVar38 = vblendmps_avx512vl(auVar40,auVar21);
      auVar47._0_4_ = (uint)(bVar35 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar44._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar47._4_4_ = (uint)bVar12 * auVar38._4_4_ | (uint)!bVar12 * auVar44._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar47._8_4_ = (uint)bVar12 * auVar38._8_4_ | (uint)!bVar12 * auVar44._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar47._12_4_ = (uint)bVar12 * auVar38._12_4_ | (uint)!bVar12 * auVar44._12_4_;
      auVar44 = vshufps_avx(auVar47,auVar47,0xb1);
      auVar44 = vminps_avx(auVar44,auVar47);
      auVar38 = vshufpd_avx(auVar44,auVar44,1);
      auVar44 = vminps_avx(auVar38,auVar44);
      auVar45 = vinsertps_avx(auVar45,auVar44,0x1c);
      auVar20._4_4_ = fStack_10f4;
      auVar20._0_4_ = local_10f8;
      auVar20._8_4_ = fStack_10f0;
      auVar20._12_4_ = fStack_10ec;
      auVar38 = vblendmps_avx512vl(auVar40,auVar20);
      auVar48._0_4_ = (uint)(bVar35 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar44._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar48._4_4_ = (uint)bVar12 * auVar38._4_4_ | (uint)!bVar12 * auVar44._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar48._8_4_ = (uint)bVar12 * auVar38._8_4_ | (uint)!bVar12 * auVar44._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar48._12_4_ = (uint)bVar12 * auVar38._12_4_ | (uint)!bVar12 * auVar44._12_4_;
      auVar44 = vshufps_avx(auVar48,auVar48,0xb1);
      auVar44 = vminps_avx(auVar44,auVar48);
      auVar38 = vshufpd_avx(auVar44,auVar44,1);
      auVar44 = vminps_avx(auVar38,auVar44);
      auVar44 = vinsertps_avx(auVar45,auVar44,0x20);
      auVar88._8_4_ = 0xff800000;
      auVar88._0_8_ = 0xff800000ff800000;
      auVar88._12_4_ = 0xff800000;
      auVar38 = vblendmps_avx512vl(auVar88,auVar22);
      auVar49._0_4_ = (uint)(bVar35 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar45._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar49._4_4_ = (uint)bVar12 * auVar38._4_4_ | (uint)!bVar12 * auVar45._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar49._8_4_ = (uint)bVar12 * auVar38._8_4_ | (uint)!bVar12 * auVar45._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar49._12_4_ = (uint)bVar12 * auVar38._12_4_ | (uint)!bVar12 * auVar45._12_4_;
      auVar45 = vshufps_avx(auVar49,auVar49,0xb1);
      auVar45 = vmaxps_avx(auVar45,auVar49);
      auVar38 = vshufpd_avx(auVar45,auVar45,1);
      auVar45 = vmaxps_avx(auVar38,auVar45);
      auVar39 = vblendmps_avx512vl(auVar88,auVar21);
      auVar50._0_4_ = (uint)(bVar35 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar38._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar38._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar38._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar50._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar38._12_4_;
      auVar38 = vshufps_avx(auVar50,auVar50,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar50);
      auVar39 = vshufpd_avx(auVar38,auVar38,1);
      auVar38 = vmaxps_avx(auVar39,auVar38);
      auVar45 = vinsertps_avx(auVar45,auVar38,0x1c);
      auVar39 = vblendmps_avx512vl(auVar88,auVar20);
      auVar51._0_4_ = (uint)(bVar35 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar38._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar51._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar38._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar51._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar38._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar51._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar38._12_4_;
      auVar38 = vshufps_avx(auVar51,auVar51,0xb1);
      auVar38 = vmaxps_avx(auVar38,auVar51);
      auVar39 = vshufpd_avx(auVar38,auVar38,1);
      auVar38 = vmaxps_avx(auVar39,auVar38);
      auVar38 = vinsertps_avx(auVar45,auVar38,0x20);
      auVar39 = vblendmps_avx512vl(auVar40,auVar89._0_16_);
      auVar52._0_4_ = (uint)(bVar35 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar45._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar52._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * auVar45._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar52._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * auVar45._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar52._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * auVar45._12_4_;
      auVar45 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar45 = vminps_avx(auVar45,auVar52);
      auVar39 = vshufpd_avx(auVar45,auVar45,1);
      auVar45 = vminps_avx(auVar39,auVar45);
      auVar41 = vblendmps_avx512vl(auVar40,auVar90._0_16_);
      auVar53._0_4_ = (uint)(bVar35 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar39._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * auVar39._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * auVar39._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar53._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * auVar39._12_4_;
      auVar39 = vshufps_avx(auVar53,auVar53,0xb1);
      auVar39 = vminps_avx(auVar39,auVar53);
      auVar41 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vminps_avx(auVar41,auVar39);
      auVar45 = vinsertps_avx(auVar45,auVar39,0x1c);
      auVar41 = vblendmps_avx512vl(auVar40,auVar91._0_16_);
      auVar54._0_4_ = (uint)(bVar35 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar39._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * auVar39._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * auVar39._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar54._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * auVar39._12_4_;
      auVar39 = vshufps_avx(auVar54,auVar54,0xb1);
      auVar39 = vminps_avx(auVar39,auVar54);
      auVar41 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vminps_avx(auVar41,auVar39);
      auVar45 = vinsertps_avx(auVar45,auVar39,0x20);
      auVar41 = vblendmps_avx512vl(auVar88,auVar89._0_16_);
      auVar55._0_4_ = (uint)(bVar35 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar39._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar55._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * auVar39._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar55._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * auVar39._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar55._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * auVar39._12_4_;
      auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
      auVar39 = vmaxps_avx(auVar39,auVar55);
      auVar41 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vmaxps_avx(auVar41,auVar39);
      auVar43 = vblendmps_avx512vl(auVar88,auVar90._0_16_);
      auVar56._0_4_ = (uint)(bVar35 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar41._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar56._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * auVar41._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar56._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * auVar41._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar56._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * auVar41._12_4_;
      auVar41 = vshufps_avx(auVar56,auVar56,0xb1);
      auVar41 = vmaxps_avx(auVar41,auVar56);
      auVar43 = vshufpd_avx(auVar41,auVar41,1);
      auVar41 = vmaxps_avx(auVar43,auVar41);
      auVar39 = vinsertps_avx(auVar39,auVar41,0x1c);
      auVar43 = vblendmps_avx512vl(auVar88,auVar91._0_16_);
      auVar57._0_4_ = (uint)(bVar35 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar41._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar57._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * auVar41._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar57._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * auVar41._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar57._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * auVar41._12_4_;
      auVar41 = vshufps_avx(auVar57,auVar57,0xb1);
      auVar41 = vmaxps_avx(auVar41,auVar57);
      auVar43 = vshufpd_avx(auVar41,auVar41,1);
      auVar41 = vmaxps_avx(auVar43,auVar41);
      auVar41 = vinsertps_avx(auVar39,auVar41,0x20);
      auVar43 = vblendmps_avx512vl(auVar40,local_1108);
      auVar58._0_4_ = (uint)(bVar35 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar35 & 1) * auVar39._0_4_
      ;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar58._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * auVar39._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar58._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * auVar39._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar58._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * auVar39._12_4_;
      auVar39 = vshufps_avx(auVar58,auVar58,0xb1);
      auVar39 = vminps_avx(auVar39,auVar58);
      auVar43 = vblendmps_avx512vl(auVar88,local_1118);
      auVar59._0_4_ =
           (uint)(bVar35 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar35 & 1) * in_ZMM17._0_4_;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar59._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * in_ZMM17._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar59._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * in_ZMM17._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar59._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * in_ZMM17._12_4_;
      in_ZMM17 = ZEXT1664(auVar59);
      auVar43 = vshufps_avx512vl(auVar59,auVar59,0xb1);
      auVar43 = vmaxps_avx512vl(auVar43,auVar59);
      auVar40 = vshufpd_avx(auVar43,auVar43,1);
      local_11d8 = vmaxps_avx(auVar40,auVar43);
      uVar29 = vcmpps_avx512vl(auVar45,ZEXT816(0) << 0x20,5);
      auVar43 = vblendmps_avx512vl(auVar41,auVar45);
      bVar11 = (byte)uVar29;
      fVar1 = (float)((uint)(bVar11 & 1) * auVar43._0_4_);
      fVar2 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar43._4_4_);
      auVar60._4_4_ = fVar2;
      auVar60._0_4_ = fVar1;
      fVar3 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar43._8_4_);
      auVar60._8_4_ = fVar3;
      fVar4 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar43._12_4_);
      auVar60._12_4_ = fVar4;
      auVar61 = vblendmps_avx512vl(auVar44,auVar38);
      bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
      bVar16 = (bool)((byte)(uVar29 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar29 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar29 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar29 >> 2) & 1);
      bVar18 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar43 = vmovshdup_avx(auVar60);
      uVar30 = (ulong)(auVar43._0_4_ < 0.0) << 4 | 0x20;
      auVar43 = vshufpd_avx(auVar60,auVar60,1);
      uVar31 = (ulong)(auVar43._0_4_ < 0.0) << 4 | 0x40;
      auVar62._0_4_ =
           (float)((uint)(bVar11 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar45._0_4_);
      bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar62._4_4_ = (float)((uint)bVar14 * auVar41._4_4_ | (uint)!bVar14 * auVar45._4_4_);
      bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar62._8_4_ = (float)((uint)bVar14 * auVar41._8_4_ | (uint)!bVar14 * auVar45._8_4_);
      bVar14 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar62._12_4_ = (float)((uint)bVar14 * auVar41._12_4_ | (uint)!bVar14 * auVar45._12_4_);
      auVar76._0_4_ =
           (float)((uint)(bVar11 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar40._0_4_) *
           fVar1;
      auVar76._4_4_ = (float)((uint)bVar12 * auVar61._4_4_ | (uint)!bVar12 * auVar40._4_4_) * fVar2;
      auVar76._8_4_ = (float)((uint)bVar16 * auVar61._8_4_ | (uint)!bVar16 * auVar40._8_4_) * fVar3;
      auVar76._12_4_ =
           (float)((uint)bVar17 * auVar61._12_4_ | (uint)!bVar17 * auVar40._12_4_) * fVar4;
      auVar71._0_4_ =
           (float)((uint)(bVar11 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar38._0_4_) *
           auVar62._0_4_;
      auVar71._4_4_ =
           (float)((uint)bVar13 * auVar44._4_4_ | (uint)!bVar13 * auVar38._4_4_) * auVar62._4_4_;
      auVar71._8_4_ =
           (float)((uint)bVar15 * auVar44._8_4_ | (uint)!bVar15 * auVar38._8_4_) * auVar62._8_4_;
      auVar71._12_4_ =
           (float)((uint)bVar18 * auVar44._12_4_ | (uint)!bVar18 * auVar38._12_4_) * auVar62._12_4_;
      uVar29 = (ulong)(fVar1 < 0.0) * 0x10;
      stack[0].ptr.ptr = *(size_t *)&pAVar10[1].bounds.bounds0.lower.field_0;
      stack[0].dist = 0;
      local_f98 = vbroadcastss_avx512vl(auVar60);
      auVar96 = ZEXT1664(local_f98);
      auVar80._4_4_ = auVar76._0_4_;
      auVar80._0_4_ = auVar76._0_4_;
      auVar80._8_4_ = auVar76._0_4_;
      auVar80._12_4_ = auVar76._0_4_;
      auVar85._8_4_ = 0x80000000;
      auVar85._0_8_ = 0x8000000080000000;
      auVar85._12_4_ = 0x80000000;
      local_fa8 = vxorps_avx512vl(auVar80,auVar85);
      auVar97 = ZEXT1664(local_fa8);
      local_fb8 = vshufps_avx512vl(auVar60,auVar60,0x55);
      auVar98 = ZEXT1664(local_fb8);
      auVar45 = vshufps_avx(auVar76,auVar76,0x55);
      local_fc8 = vxorps_avx512vl(auVar45,auVar85);
      auVar99 = ZEXT1664(local_fc8);
      local_fd8 = vshufps_avx512vl(auVar60,auVar60,0xaa);
      auVar100 = ZEXT1664(local_fd8);
      auVar45 = vshufps_avx(auVar76,auVar76,0xaa);
      local_fe8 = vxorps_avx512vl(auVar45,auVar85);
      auVar101 = ZEXT1664(local_fe8);
      local_ff8 = vbroadcastss_avx512vl(auVar62);
      auVar102 = ZEXT1664(local_ff8);
      auVar77._4_4_ = auVar71._0_4_;
      auVar77._0_4_ = auVar71._0_4_;
      auVar77._8_4_ = auVar71._0_4_;
      auVar77._12_4_ = auVar71._0_4_;
      local_1008 = vxorps_avx512vl(auVar77,auVar85);
      auVar103 = ZEXT1664(local_1008);
      local_1018 = vshufps_avx512vl(auVar62,auVar62,0x55);
      auVar104 = ZEXT1664(local_1018);
      auVar45 = vshufps_avx(auVar71,auVar71,0x55);
      local_1028 = vxorps_avx512vl(auVar45,auVar85);
      auVar105 = ZEXT1664(local_1028);
      local_1038 = vshufps_avx512vl(auVar62,auVar62,0xaa);
      auVar106 = ZEXT1664(local_1038);
      auVar45 = vshufps_avx(auVar71,auVar71,0xaa);
      local_1048 = vxorps_avx512vl(auVar45,auVar85);
      auVar107 = ZEXT1664(local_1048);
      uVar65 = auVar39._0_4_;
      auVar67._4_4_ = uVar65;
      auVar67._0_4_ = uVar65;
      auVar67._8_4_ = uVar65;
      auVar67._12_4_ = uVar65;
      auVar45 = vshufps_avx(auVar39,auVar39,0xaa);
      local_1058 = vminps_avx512vl(auVar45,auVar67);
      auVar108 = ZEXT1664(local_1058);
      auVar68._8_4_ = 0x7f800000;
      auVar68._0_8_ = 0x7f8000007f800000;
      auVar68._12_4_ = 0x7f800000;
      auVar45 = vpblendmd_avx512vl(auVar68,local_1108);
      auVar63._0_4_ =
           (uint)(bVar35 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar35 & 1) * in_ZMM31._0_4_;
      bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar63._4_4_ = (uint)bVar12 * auVar45._4_4_ | (uint)!bVar12 * in_ZMM31._4_4_;
      bVar12 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar63._8_4_ = (uint)bVar12 * auVar45._8_4_ | (uint)!bVar12 * in_ZMM31._8_4_;
      bVar12 = SUB81(uVar37 >> 3,0);
      auVar63._12_4_ = (uint)bVar12 * auVar45._12_4_ | (uint)!bVar12 * in_ZMM31._12_4_;
      in_ZMM31 = ZEXT1664(auVar63);
      uVar65 = local_11d8._0_4_;
      auVar70 = ZEXT1664(CONCAT412(uVar65,CONCAT48(uVar65,CONCAT44(uVar65,uVar65))));
      pSVar26 = stack + 1;
      local_1068 = vmovdqa64_avx512vl(auVar63);
      do {
        uVar27 = pSVar26[-1].dist;
        auVar72._4_4_ = uVar27;
        auVar72._0_4_ = uVar27;
        auVar72._8_4_ = uVar27;
        auVar72._12_4_ = uVar27;
        auVar73 = ZEXT1664(auVar72);
        pSVar26 = pSVar26 + -1;
        auVar45 = in_ZMM17._0_16_;
        uVar19 = vcmpps_avx512vl(auVar72,auVar45,1);
        if ((char)uVar19 != '\0') {
          sVar32 = (pSVar26->ptr).ptr;
          while ((sVar32 & 8) == 0) {
            auVar44 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar32 + 0x20 + uVar29),auVar97._0_16_,
                                 auVar96._0_16_);
            auVar38 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar32 + 0x20 + uVar30),auVar99._0_16_,
                                 auVar98._0_16_);
            auVar44 = vpmaxsd_avx(auVar44,auVar38);
            auVar38 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar32 + 0x20 + uVar31),auVar101._0_16_,
                                 auVar100._0_16_);
            auVar38 = vpmaxsd_avx512vl(auVar38,auVar108._0_16_);
            fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vpmaxsd_avx(auVar44,auVar38);
            auVar44 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar32 + 0x20 + (uVar29 ^ 0x10)),
                                 auVar103._0_16_,auVar102._0_16_);
            auVar38 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar32 + 0x20 + (uVar30 ^ 0x10)),
                                 auVar105._0_16_,auVar104._0_16_);
            auVar44 = vpminsd_avx(auVar44,auVar38);
            auVar38 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [16])(sVar32 + 0x20 + (uVar31 ^ 0x10)),
                                 auVar107._0_16_,auVar106._0_16_);
            auVar38 = vpminsd_avx(auVar38,auVar70._0_16_);
            auVar44 = vpminsd_avx(auVar44,auVar38);
            uVar37 = vcmpps_avx512vl((undefined1  [16])fmin.field_0,auVar44,2);
            if ((char)uVar37 == '\0') goto LAB_006f15da;
            auVar73 = ZEXT1664(auVar95._0_16_);
            uVar28 = 0;
            sVar33 = 8;
            do {
              lVar25 = 0;
              for (uVar23 = uVar37; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                lVar25 = lVar25 + 1;
              }
              uVar65 = *(undefined4 *)(sVar32 + 0x20 + lVar25 * 4);
              auVar74._4_4_ = uVar65;
              auVar74._0_4_ = uVar65;
              auVar74._8_4_ = uVar65;
              auVar74._12_4_ = uVar65;
              auVar39 = vfmadd132ps_fma(auVar74,auVar92._0_16_,auVar89._0_16_);
              uVar65 = *(undefined4 *)(sVar32 + 0x40 + lVar25 * 4);
              auVar78._4_4_ = uVar65;
              auVar78._0_4_ = uVar65;
              auVar78._8_4_ = uVar65;
              auVar78._12_4_ = uVar65;
              auVar41 = vfmadd132ps_fma(auVar78,auVar93._0_16_,auVar90._0_16_);
              uVar65 = *(undefined4 *)(sVar32 + 0x60 + lVar25 * 4);
              auVar81._4_4_ = uVar65;
              auVar81._0_4_ = uVar65;
              auVar81._8_4_ = uVar65;
              auVar81._12_4_ = uVar65;
              auVar43 = vfmadd132ps_fma(auVar81,auVar94._0_16_,auVar91._0_16_);
              uVar65 = *(undefined4 *)(sVar32 + 0x30 + lVar25 * 4);
              auVar84._4_4_ = uVar65;
              auVar84._0_4_ = uVar65;
              auVar84._8_4_ = uVar65;
              auVar84._12_4_ = uVar65;
              auVar40 = vfmadd132ps_fma(auVar84,auVar92._0_16_,auVar89._0_16_);
              uVar65 = *(undefined4 *)(sVar32 + 0x50 + lVar25 * 4);
              auVar86._4_4_ = uVar65;
              auVar86._0_4_ = uVar65;
              auVar86._8_4_ = uVar65;
              auVar86._12_4_ = uVar65;
              auVar61 = vfmadd132ps_fma(auVar86,auVar93._0_16_,auVar90._0_16_);
              uVar65 = *(undefined4 *)(sVar32 + 0x70 + lVar25 * 4);
              auVar87._4_4_ = uVar65;
              auVar87._0_4_ = uVar65;
              auVar87._8_4_ = uVar65;
              auVar87._12_4_ = uVar65;
              auVar42 = vfmadd132ps_fma(auVar87,auVar94._0_16_,auVar91._0_16_);
              auVar44 = vpminsd_avx(auVar39,auVar40);
              auVar38 = vpminsd_avx(auVar41,auVar61);
              auVar44 = vpmaxsd_avx(auVar44,auVar38);
              auVar38 = vpminsd_avx(auVar43,auVar42);
              auVar38 = vpmaxsd_avx512vl(auVar38,in_ZMM31._0_16_);
              auVar44 = vpmaxsd_avx(auVar44,auVar38);
              auVar38 = vpmaxsd_avx(auVar39,auVar40);
              auVar39 = vpmaxsd_avx(auVar41,auVar61);
              auVar39 = vpminsd_avx(auVar38,auVar39);
              auVar38 = vpmaxsd_avx(auVar43,auVar42);
              auVar38 = vpminsd_avx512vl(auVar38,auVar45);
              auVar38 = vpminsd_avx(auVar39,auVar38);
              uVar23 = vpcmpd_avx512vl(auVar44,auVar38,2);
              sVar34 = sVar33;
              if ((uVar23 & 0xf) != 0) {
                iVar8 = fmin.field_0.i[lVar25];
                auVar75._4_4_ = iVar8;
                auVar75._0_4_ = iVar8;
                auVar75._8_4_ = iVar8;
                auVar75._12_4_ = iVar8;
                sVar34 = *(size_t *)(sVar32 + lVar25 * 8);
                auVar44 = auVar73._0_16_;
                uVar19 = vcmpps_avx512vl(auVar75,auVar44,1);
                if ((char)uVar19 == '\0') {
                  (pSVar26->ptr).ptr = sVar34;
                  sVar34 = sVar33;
                }
                else {
                  if (sVar33 == 8) {
                    auVar73 = ZEXT1664(auVar75);
                    goto LAB_006f12f6;
                  }
                  (pSVar26->ptr).ptr = sVar33;
                  auVar73 = ZEXT1664(auVar75);
                  auVar75 = auVar44;
                }
                uVar28 = uVar28 + 1;
                pSVar26->dist = auVar75._0_4_;
                pSVar26 = pSVar26 + 1;
              }
LAB_006f12f6:
              uVar37 = uVar37 - 1 & uVar37;
              sVar33 = sVar34;
            } while (uVar37 != 0);
            if (sVar34 == 8) goto LAB_006f15da;
            sVar32 = sVar34;
            if (1 < uVar28) {
              pSVar5 = pSVar26 + -2;
              pSVar6 = pSVar26 + -1;
              if (pSVar26[-2].dist < pSVar26[-1].dist) {
                SVar9 = *pSVar5;
                pSVar26[-2].dist = pSVar26[-1].dist;
                (pSVar5->ptr).ptr = (pSVar6->ptr).ptr;
                local_11c8.valid = (int *)SVar9.ptr.ptr;
                (pSVar6->ptr).ptr = (size_t)local_11c8.valid;
                local_11c8.geometryUserPtr._0_4_ = SVar9.dist;
                pSVar26[-1].dist = (uint)local_11c8.geometryUserPtr;
              }
              if (uVar28 != 2) {
                pSVar7 = pSVar26 + -3;
                uVar27 = pSVar26[-3].dist;
                if (uVar27 < pSVar26[-1].dist) {
                  SVar9 = *pSVar7;
                  pSVar26[-3].dist = pSVar26[-1].dist;
                  (pSVar7->ptr).ptr = (pSVar6->ptr).ptr;
                  local_11c8.valid = (int *)SVar9.ptr.ptr;
                  (pSVar6->ptr).ptr = (size_t)local_11c8.valid;
                  local_11c8.geometryUserPtr._0_4_ = SVar9.dist;
                  pSVar26[-1].dist = (uint)local_11c8.geometryUserPtr;
                  uVar27 = pSVar26[-3].dist;
                }
                if (uVar27 < pSVar26[-2].dist) {
                  SVar9 = *pSVar7;
                  pSVar26[-3].dist = pSVar26[-2].dist;
                  (pSVar7->ptr).ptr = (pSVar5->ptr).ptr;
                  local_11c8.valid = (int *)SVar9.ptr.ptr;
                  (pSVar5->ptr).ptr = (size_t)local_11c8.valid;
                  local_11c8.geometryUserPtr._0_4_ = SVar9.dist;
                  pSVar26[-2].dist = (uint)local_11c8.geometryUserPtr;
                }
              }
            }
          }
          uVar37 = vcmpps_avx512vl(auVar45,auVar73._0_16_,6);
          if ((char)uVar37 != '\0') {
            uVar23 = (ulong)((uint)sVar32 & 0xf);
            uVar28 = uVar37;
            if (uVar23 != 8) {
              lVar25 = 0;
              local_f88 = auVar45;
              do {
                local_11c8.geomID = *(uint *)((sVar32 & 0xfffffffffffffff0) + lVar25 * 8);
                local_1198 = (context->scene->geometries).items[local_11c8.geomID].ptr;
                uVar27 = local_1198->mask;
                auVar69._4_4_ = uVar27;
                auVar69._0_4_ = uVar27;
                auVar69._8_4_ = uVar27;
                auVar69._12_4_ = uVar27;
                uVar19 = vptestmd_avx512vl(auVar69,*(undefined1 (*) [16])(ray + 0x90));
                bVar11 = (byte)uVar19 & 0xf & (byte)uVar28;
                if (bVar11 != 0) {
                  local_11c8.primID = *(uint *)((sVar32 & 0xfffffffffffffff0) + 4 + lVar25 * 8);
                  fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vpmovm2d_avx512vl((ulong)bVar11);
                  local_11c8.geometryUserPtr = local_1198->userPtr;
                  local_11c8.valid = (int *)&fmin;
                  local_11c8.context = context->user;
                  local_11c8.N = 4;
                  local_1190 = 0;
                  local_1188 = context->args;
                  pp_Var24 = (_func_int **)local_1188->intersect;
                  if (pp_Var24 == (_func_int **)0x0) {
                    pp_Var24 = local_1198[1].super_RefCount._vptr_RefCount;
                  }
                  local_11c8.rayhit = (RTCRayHitN *)ray;
                  (*(code *)pp_Var24)(&local_11c8);
                  auVar89 = ZEXT1664(local_1078);
                  auVar90 = ZEXT1664(local_1088);
                  auVar91 = ZEXT1664(local_1098);
                  auVar92 = ZEXT1664(local_10a8);
                  auVar93 = ZEXT1664(local_10b8);
                  auVar94 = ZEXT1664(local_10c8);
                  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar95 = ZEXT1664(auVar45);
                  in_ZMM17 = ZEXT1664(local_f88);
                  auVar96 = ZEXT1664(local_f98);
                  auVar97 = ZEXT1664(local_fa8);
                  auVar98 = ZEXT1664(local_fb8);
                  auVar99 = ZEXT1664(local_fc8);
                  auVar100 = ZEXT1664(local_fd8);
                  auVar101 = ZEXT1664(local_fe8);
                  auVar102 = ZEXT1664(local_ff8);
                  auVar103 = ZEXT1664(local_1008);
                  auVar104 = ZEXT1664(local_1018);
                  auVar105 = ZEXT1664(local_1028);
                  auVar106 = ZEXT1664(local_1038);
                  auVar107 = ZEXT1664(local_1048);
                  auVar108 = ZEXT1664(local_1058);
                  auVar45 = vmovdqa64_avx512vl(local_1068);
                  in_ZMM31 = ZEXT1664(auVar45);
                  uVar28 = uVar37 & 0xffff;
                }
                lVar25 = lVar25 + 1;
              } while (uVar23 - 8 != lVar25);
            }
            auVar45 = *(undefined1 (*) [16])(ray + 0x80);
            uVar19 = vcmpps_avx512vl(auVar45,in_ZMM17._0_16_,1);
            if ((byte)((byte)uVar19 & (byte)uVar28) != 0) {
              bVar12 = (bool)((byte)uVar28 & 1);
              auVar64._0_4_ = (uint)bVar12 * auVar45._0_4_ | (uint)!bVar12 * in_ZMM17._0_4_;
              bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
              auVar64._4_4_ = (uint)bVar12 * auVar45._4_4_ | (uint)!bVar12 * in_ZMM17._4_4_;
              bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
              auVar64._8_4_ = (uint)bVar12 * auVar45._8_4_ | (uint)!bVar12 * in_ZMM17._8_4_;
              bVar12 = (bool)((byte)(uVar28 >> 3) & 1);
              auVar64._12_4_ = (uint)bVar12 * auVar45._12_4_ | (uint)!bVar12 * in_ZMM17._12_4_;
              in_ZMM17 = ZEXT1664(auVar64);
              auVar45 = vshufps_avx512vl(auVar64,auVar64,0xb1);
              auVar44 = vmaxps_avx512vl(auVar45,auVar64);
              auVar45 = vshufpd_avx(auVar44,auVar44,1);
              local_11d8 = vmaxss_avx(auVar45,auVar44);
            }
          }
        }
        uVar65 = local_11d8._0_4_;
        auVar70 = ZEXT1664(CONCAT412(uVar65,CONCAT48(uVar65,CONCAT44(uVar65,uVar65))));
LAB_006f15da:
      } while (pSVar26 != stack);
    } while (uVar36 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator !=(const vint4& a, const vint4& b) { return _mm_cmp_epi32_mask(a,b,_MM_CMPINT_NE); }